

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt_mem.c
# Opt level: O0

zt_mem_set * zt_mem_set_init(char *name)

{
  char *pcVar1;
  zt_mem_set *set;
  zt_mem_set *local_8;
  
  local_8 = (zt_mem_set *)(*GLOBAL_zmt.alloc)(0x28);
  if (local_8 == (zt_mem_set *)0x0) {
    local_8 = (zt_mem_set *)0x0;
  }
  else {
    (local_8->set_list).prev = (zt_elist *)local_8;
    (local_8->set_list).next = (zt_elist *)local_8;
    (local_8->elt_list).prev = &local_8->elt_list;
    (local_8->elt_list).next = &local_8->elt_list;
    pcVar1 = zt_mem_strdup((char *)local_8);
    local_8->name = pcVar1;
  }
  return local_8;
}

Assistant:

zt_mem_set *
zt_mem_set_init(char *name)
{
    zt_mem_set * set;

    if ((set = GLOBAL_zmt.alloc(sizeof(zt_mem_set))) == 0) {
        return NULL;
    }

    zt_elist_reset(&set->set_list);
    zt_elist_reset(&set->elt_list);

    set->name = zt_mem_strdup(name ? name : "*unknown*");

    return set;
}